

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_utils.c
# Opt level: O3

char * directory_read_extend(DIR *ref,char *win32buffer)

{
  dirent *pdVar1;
  
  if (ref == (DIR *)0x0) {
    return (char *)0x0;
  }
  do {
    pdVar1 = readdir((DIR *)ref);
    if (pdVar1 == (dirent *)0x0) {
      closedir((DIR *)ref);
      return (char *)0x0;
    }
  } while ((pdVar1->d_name[0] == '\0') ||
          ((pdVar1->d_name[0] == '.' &&
           ((pdVar1->d_name[1] == '\0' ||
            ((pdVar1->d_name[1] == '.' && (pdVar1->d_name[2] == '\0'))))))));
  return pdVar1->d_name;
}

Assistant:

char *directory_read_extend (DIRREF ref, char *win32buffer) {
    if (ref == NULL) return NULL;
    
    while (1) {
        #ifdef WIN32
        WIN32_FIND_DATAA findData;
        
        if (FindNextFileA(ref, &findData) == 0) {
            FindClose(ref);
            return NULL;
        }
        if (findData.dwFileAttributes & FILE_ATTRIBUTE_DIRECTORY) continue;
        if (findData.cFileName[0] == '\0') continue;
        if (findData.cFileName[0] == '.') continue;
        // cFileName from WIN32_FIND_DATAA is a fixed size array, and findData is local
        // This line of code is under the assumption that `win32buffer` is at least MAX_PATH in size!
        return !win32buffer ? NULL : memcpy(win32buffer, findData.cFileName, sizeof(findData.cFileName));
        #else
        UNUSED_PARAM(win32buffer);
        struct dirent *d;
        if ((d = readdir(ref)) == NULL) {
            closedir(ref);
            return NULL;
        }
        if (d->d_name[0] == '\0') continue;
        if (strcmp(d->d_name, ".") == 0) continue;
        if (strcmp(d->d_name, "..") == 0) continue;
        return (char *)d->d_name;
        #endif
    }
    return NULL;
}